

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ItemSimilarityRecommender::clear_itemint64ids
          (ItemSimilarityRecommender *this)

{
  Int64Vector *this_00;
  Arena *pAVar1;
  ItemSimilarityRecommender *this_local;
  
  pAVar1 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  if (((pAVar1 == (Arena *)0x0) && (this->itemint64ids_ != (Int64Vector *)0x0)) &&
     (this_00 = this->itemint64ids_, this_00 != (Int64Vector *)0x0)) {
    Int64Vector::~Int64Vector(this_00);
    operator_delete(this_00,0x28);
  }
  this->itemint64ids_ = (Int64Vector *)0x0;
  return;
}

Assistant:

void ItemSimilarityRecommender::clear_itemint64ids() {
  if (GetArenaForAllocation() == nullptr && itemint64ids_ != nullptr) {
    delete itemint64ids_;
  }
  itemint64ids_ = nullptr;
}